

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.hpp
# Opt level: O3

void supermap::io::SerializeHelper<supermap::ByteArray<4096UL>,_void>::serialize
               (ByteArray<4096UL> *ar,ostream *os)

{
  IOException *this;
  long *plVar1;
  long *plVar2;
  string local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::ostream::write((char *)os,
                      (long)(ar->data_)._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  if (*(int *)(os + *(long *)(*(long *)os + -0x18) + 0x20) == 0) {
    return;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_80,0x1000);
  std::operator+(&local_40,"Unsuccessful serialization, expected to write ",&local_80);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_60 == plVar2) {
    local_50 = *plVar2;
    lStack_48 = plVar1[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar2;
  }
  local_58 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  supermap::IOException::IOException(this,(string *)&local_60);
  __cxa_throw(this,&IOException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static void serialize(const ByteArray<Len> &ar, std::ostream &os) {
        os.write(ar.getCharsPointer(), Len);
        if (!os.good()) {
            throw IOException("Unsuccessful serialization, expected to write " + std::to_string(Len) + " bytes");
        }
    }